

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
::emplace_new_key<slang::BufferID>
          (sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
           *this,int8_t distance_from_desired,EntryPointer current_entry,BufferID *key)

{
  uint32_t uVar1;
  anon_union_4_1_a8c68091_for_sherwood_v3_entry<slang::BufferID>_3 aVar2;
  undefined8 in_RAX;
  anon_union_4_1_a8c68091_for_sherwood_v3_entry<slang::BufferID>_3 aVar3;
  size_t sVar4;
  long lVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  char cVar8;
  char __tmp_3;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
  pVar12;
  undefined8 uStack_18;
  char cVar9;
  
  uStack_18 = in_RAX;
  if ((this->num_slots_minus_one != 0) && (this->max_lookups != distance_from_desired)) {
    sVar4 = this->num_elements + 1;
    auVar10._8_4_ = (int)(sVar4 >> 0x20);
    auVar10._0_8_ = sVar4;
    auVar10._12_4_ = 0x45300000;
    lVar5 = this->num_slots_minus_one + 1;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    if ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) <=
        (double)this->_max_load_factor *
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      cVar9 = current_entry->distance_from_desired;
      if (cVar9 < '\0') {
        psVar7 = (EntryPointer)(ulong)key->id;
        (current_entry->field_1).value.id = key->id;
        current_entry->distance_from_desired = distance_from_desired;
        this->num_elements = sVar4;
LAB_0015047f:
        pVar12._9_7_ = (int7)((ulong)psVar7 >> 8);
        pVar12.second = true;
        pVar12.first.current = current_entry;
        return pVar12;
      }
      uVar1 = key->id;
      current_entry->distance_from_desired = distance_from_desired;
      aVar3 = current_entry->field_1;
      (current_entry->field_1).value.id = uVar1;
      psVar7 = current_entry;
      do {
        cVar8 = cVar9 + '\x01';
        psVar6 = psVar7;
        while( true ) {
          psVar7 = psVar6 + 1;
          cVar9 = psVar7->distance_from_desired;
          if (cVar9 < '\0') {
            psVar6[1].field_1 = aVar3;
            psVar7->distance_from_desired = cVar8;
            this->num_elements = this->num_elements + 1;
            goto LAB_0015047f;
          }
          if (cVar9 < cVar8) break;
          cVar8 = cVar8 + '\x01';
          psVar6 = psVar7;
          if (this->max_lookups == cVar8) {
            key = (BufferID *)((long)&uStack_18 + 4);
            uStack_18 = CONCAT44(current_entry->field_1,(int)in_RAX);
            current_entry->field_1 = aVar3;
            goto LAB_00150491;
          }
        }
        psVar7->distance_from_desired = cVar8;
        aVar2 = psVar6[1].field_1;
        psVar6[1].field_1 = aVar3;
        aVar3 = aVar2;
      } while( true );
    }
  }
LAB_00150491:
  grow(this);
  pVar12 = emplace<slang::BufferID>(this,key);
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }